

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.cpp
# Opt level: O3

Sexp * Builtin_Sub(Sexp *fst,Sexp *snd)

{
  Sexp *pSVar1;
  undefined8 *puVar2;
  Sexp *local_78;
  Sexp *fst_local;
  undefined8 local_68;
  undefined1 local_60 [24];
  uint64_t local_48;
  undefined1 local_40 [24];
  Sexp *snd_local;
  FrameProtector __frame_prot;
  
  local_78 = fst;
  local_40._16_8_ = snd;
  FrameProtector::FrameProtector((FrameProtector *)&snd_local,"Builtin_Sub");
  FrameProtector::ProtectValue((FrameProtector *)&snd_local,&local_78,"fst");
  FrameProtector::ProtectValue((FrameProtector *)&snd_local,(Sexp **)(local_40 + 0x10),"snd");
  if (local_78->kind != FIXNUM) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
    fst_local = (Sexp *)local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&fst_local,"type error: not a fixnum","");
    *puVar2 = &PTR__JetRuntimeException_00125918;
    puVar2[1] = puVar2 + 3;
    if (fst_local == (Sexp *)local_60) {
      puVar2[3] = CONCAT71(local_60._1_7_,local_60[0]);
      puVar2[4] = local_60._8_8_;
    }
    else {
      puVar2[1] = fst_local;
      puVar2[3] = CONCAT71(local_60._1_7_,local_60[0]);
    }
    puVar2[2] = local_68;
    local_68 = 0;
    local_60[0] = EMPTY;
    fst_local = (Sexp *)local_60;
    __cxa_throw(puVar2,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
  }
  if (*(Kind *)local_40._16_8_ == FIXNUM) {
    pSVar1 = GcHeap::AllocateFixnum
                       ((local_78->field_1).fixnum_value -
                        ((anon_union_16_11_d0fa9a51_for_Sexp_2 *)(local_40._16_8_ + 8))->
                        fixnum_value);
    FrameProtector::~FrameProtector((FrameProtector *)&snd_local);
    return pSVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
  local_60._16_8_ = (Sexp *)local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_60 + 0x10),"type error: not a fixnum","");
  *puVar2 = &PTR__JetRuntimeException_00125918;
  puVar2[1] = puVar2 + 3;
  if ((Sexp *)local_60._16_8_ == (Sexp *)local_40) {
    puVar2[3] = CONCAT71(local_40._1_7_,local_40[0]);
    puVar2[4] = local_40._8_8_;
  }
  else {
    puVar2[1] = local_60._16_8_;
    puVar2[3] = CONCAT71(local_40._1_7_,local_40[0]);
  }
  puVar2[2] = local_48;
  local_48 = 0;
  local_40[0] = EMPTY;
  local_60._16_8_ = (Sexp *)local_40;
  __cxa_throw(puVar2,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
}

Assistant:

Sexp *Builtin_Sub(Sexp *fst, Sexp *snd) {
  GC_HELPER_FRAME;
  GC_PROTECT(fst);
  GC_PROTECT(snd);

  if (!fst->IsFixnum()) {
    throw JetRuntimeException("type error: not a fixnum");
  }

  if (!snd->IsFixnum()) {
    throw JetRuntimeException("type error: not a fixnum");
  }

  return GcHeap::AllocateFixnum(fst->fixnum_value - snd->fixnum_value);
}